

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-helpers.c++
# Opt level: O2

bool kj::_::hasSubstring(StringPtr haystack,StringPtr needle)

{
  bool bVar1;
  size_t sVar2;
  bool bVar3;
  size_t sVar4;
  size_t i;
  ulong uVar5;
  StringPtr local_50;
  StringPtr local_40;
  
  sVar4 = haystack.content.size_;
  local_50.content.size_ = needle.content.size_;
  local_50.content.ptr = needle.content.ptr;
  if (sVar4 - 1 < local_50.content.size_ - 1) {
    bVar3 = false;
  }
  else {
    uVar5 = 0;
    sVar2 = sVar4;
    do {
      bVar3 = uVar5 <= sVar4 - local_50.content.size_;
      if (sVar4 - local_50.content.size_ < uVar5) {
        return bVar3;
      }
      local_40.content.ptr = haystack.content.ptr + uVar5;
      local_40.content.size_ = sVar2;
      bVar1 = StringPtr::startsWith(&local_40,&local_50);
      uVar5 = uVar5 + 1;
      sVar2 = sVar2 - 1;
    } while (!bVar1);
  }
  return bVar3;
}

Assistant:

bool hasSubstring(StringPtr haystack, StringPtr needle) {
  // TODO(perf): This is not the best algorithm for substring matching.
  if (needle.size() <= haystack.size()) {
    for (size_t i = 0; i <= haystack.size() - needle.size(); i++) {
      if (haystack.slice(i).startsWith(needle)) {
        return true;
      }
    }
  }
  return false;
}